

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_vertical_8_dual_sse2
               (uint16_t *s,int p,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,uint8_t *blimit1
               ,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  undefined1 auVar1 [16];
  __m128i alVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar17;
  undefined1 auVar10 [16];
  undefined1 auVar18 [16];
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  undefined1 auVar35 [16];
  ushort uVar36;
  short sVar37;
  ushort uVar40;
  ushort uVar42;
  ushort uVar44;
  ushort uVar46;
  ushort uVar48;
  ushort uVar50;
  ushort uVar52;
  undefined1 auVar38 [16];
  short sVar41;
  short sVar43;
  short sVar45;
  short sVar47;
  short sVar49;
  short sVar51;
  short sVar53;
  undefined1 auVar39 [16];
  ushort uVar54;
  short sVar55;
  ushort uVar57;
  short sVar58;
  ushort uVar59;
  short sVar60;
  ushort uVar61;
  short sVar62;
  ushort uVar63;
  short sVar64;
  ushort uVar65;
  short sVar66;
  ushort uVar67;
  short sVar68;
  ushort uVar69;
  short sVar70;
  undefined1 auVar56 [16];
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  undefined1 auVar80 [16];
  __m128i d4;
  __m128i local_298;
  __m128i x6;
  __m128i local_238;
  __m128i local_228;
  __m128i d0;
  __m128i x7;
  __m128i x5;
  __m128i x4;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  longlong local_198;
  longlong lStack_190;
  __m128i local_188;
  __m128i local_178;
  __m128i local_168;
  undefined1 local_158 [4];
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  undefined1 local_148 [4];
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  __m128i local_138;
  __m128i local_128;
  __m128i local_118;
  __m128i local_108;
  __m128i d7;
  __m128i local_e8;
  __m128i local_d8;
  __m128i t80;
  __m128i thresh0_1;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  __m128i limit0_1;
  __m128i blimit0_1;
  __m128i local_78;
  __m128i local_68;
  __m128i p_1 [2];
  
  x0[0] = *(longlong *)(s + -4);
  x0[1] = *(longlong *)s;
  x1[0] = *(longlong *)(s + (long)p + -4);
  x1[1] = *(longlong *)(s + (long)p + -4 + 4);
  x2[0] = *(longlong *)(s + (long)(p * 2) + -4);
  x2[1] = *(longlong *)(s + (long)(p * 2) + -4 + 4);
  x3[0] = *(longlong *)(s + (long)(p * 3) + -4);
  x3[1] = *(longlong *)(s + (long)(p * 3) + -4 + 4);
  x4[0] = *(longlong *)(s + (long)(p * 4) + -4);
  x4[1] = *(longlong *)(s + (long)(p * 4) + -4 + 4);
  x5[0] = *(longlong *)(s + (long)(p * 5) + -4);
  x5[1] = *(longlong *)(s + (long)(p * 5) + -4 + 4);
  x6[0] = *(longlong *)(s + (long)(p * 6) + -4);
  x6[1] = *(longlong *)(s + (long)(p * 6) + -4 + 4);
  x7[0] = *(longlong *)(s + (long)(p * 7) + -4);
  x7[1] = *(longlong *)(s + (long)(p * 7) + -4 + 4);
  highbd_transpose8x8_sse2
            (&x0,&x1,&x2,&x3,&x4,&x5,&x6,&x7,&d0,&local_298,&local_d8,&local_e8,&d4,&local_228,
             &local_238,&d7);
  get_limit_dual(blimit0,limit0,thresh0,blimit1,limit1,thresh1,bd,&blimit0_1,&limit0_1,&thresh0_1,
                 &t80);
  alVar2 = local_298;
  auVar3 = psubusw((undefined1  [16])local_e8,(undefined1  [16])d4);
  auVar5 = psubusw((undefined1  [16])d4,(undefined1  [16])local_e8);
  auVar4 = psubusw((undefined1  [16])local_d8,(undefined1  [16])local_228);
  auVar8 = psubusw((undefined1  [16])local_228,(undefined1  [16])local_d8);
  auVar8 = auVar8 | auVar4;
  auVar3 = paddusw(auVar5 | auVar3,auVar5 | auVar3);
  auVar9._0_2_ = auVar8._0_2_ >> 1;
  auVar9._2_2_ = auVar8._2_2_ >> 1;
  auVar9._4_2_ = auVar8._4_2_ >> 1;
  auVar9._6_2_ = auVar8._6_2_ >> 1;
  auVar9._8_2_ = auVar8._8_2_ >> 1;
  auVar9._10_2_ = auVar8._10_2_ >> 1;
  auVar9._12_2_ = auVar8._12_2_ >> 1;
  auVar9._14_2_ = auVar8._14_2_ >> 1;
  auVar4 = paddusw(auVar9,auVar3);
  auVar4 = auVar4 ^ _DAT_00433870;
  auVar3 = _DAT_00433870 ^ (undefined1  [16])blimit0_1;
  auVar8._0_2_ = -(ushort)(auVar3._0_2_ < auVar4._0_2_);
  auVar8._2_2_ = -(ushort)(auVar3._2_2_ < auVar4._2_2_);
  auVar8._4_2_ = -(ushort)(auVar3._4_2_ < auVar4._4_2_);
  auVar8._6_2_ = -(ushort)(auVar3._6_2_ < auVar4._6_2_);
  auVar8._8_2_ = -(ushort)(auVar3._8_2_ < auVar4._8_2_);
  auVar8._10_2_ = -(ushort)(auVar3._10_2_ < auVar4._10_2_);
  auVar8._12_2_ = -(ushort)(auVar3._12_2_ < auVar4._12_2_);
  auVar8._14_2_ = -(ushort)(auVar3._14_2_ < auVar4._14_2_);
  auVar3 = paddusw((undefined1  [16])limit0_1,_DAT_0046d7b0);
  auVar3 = auVar3 & auVar8;
  auVar4 = psubusw((undefined1  [16])d0,(undefined1  [16])local_298);
  auVar5 = psubusw((undefined1  [16])local_298,(undefined1  [16])d0);
  auVar5 = auVar5 | auVar4;
  auVar8 = psubusw((undefined1  [16])local_298,(undefined1  [16])local_d8);
  auVar4 = psubusw((undefined1  [16])local_d8,(undefined1  [16])local_298);
  auVar4 = auVar4 | auVar8;
  sVar19 = auVar5._0_2_;
  sVar20 = auVar4._0_2_;
  uVar7 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._2_2_;
  sVar20 = auVar4._2_2_;
  uVar11 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._4_2_;
  sVar20 = auVar4._4_2_;
  uVar12 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._6_2_;
  sVar20 = auVar4._6_2_;
  uVar13 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._8_2_;
  sVar20 = auVar4._8_2_;
  uVar14 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._10_2_;
  sVar20 = auVar4._10_2_;
  uVar15 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._12_2_;
  sVar20 = auVar4._12_2_;
  sVar21 = auVar4._14_2_;
  uVar16 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._14_2_;
  uVar17 = (ushort)(sVar21 < sVar19) * sVar19 | (ushort)(sVar21 >= sVar19) * sVar21;
  auVar4 = psubusw((undefined1  [16])local_d8,(undefined1  [16])local_e8);
  local_128[0] = local_e8[0];
  local_128[1] = local_e8[1];
  auVar5 = psubusw((undefined1  [16])local_e8,(undefined1  [16])local_d8);
  auVar5 = auVar5 | auVar4;
  auVar4 = psubusw((undefined1  [16])local_228,(undefined1  [16])d4);
  local_138[0] = d4[0];
  local_138[1] = d4[1];
  auVar8 = psubusw((undefined1  [16])d4,(undefined1  [16])local_228);
  auVar8 = auVar8 | auVar4;
  sVar19 = auVar5._0_2_;
  sVar20 = auVar8._0_2_;
  uVar54 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._2_2_;
  sVar20 = auVar8._2_2_;
  uVar57 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._4_2_;
  sVar20 = auVar8._4_2_;
  uVar59 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._6_2_;
  sVar20 = auVar8._6_2_;
  uVar61 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._8_2_;
  sVar20 = auVar8._8_2_;
  uVar63 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._10_2_;
  sVar20 = auVar8._10_2_;
  uVar65 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._12_2_;
  sVar20 = auVar8._12_2_;
  sVar21 = auVar8._14_2_;
  uVar67 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._14_2_;
  uVar69 = (ushort)(sVar21 < sVar19) * sVar19 | (ushort)(sVar21 >= sVar19) * sVar21;
  uVar7 = ((short)uVar7 < (short)uVar54) * uVar54 | ((short)uVar7 >= (short)uVar54) * uVar7;
  uVar11 = ((short)uVar11 < (short)uVar57) * uVar57 | ((short)uVar11 >= (short)uVar57) * uVar11;
  uVar12 = ((short)uVar12 < (short)uVar59) * uVar59 | ((short)uVar12 >= (short)uVar59) * uVar12;
  uVar13 = ((short)uVar13 < (short)uVar61) * uVar61 | ((short)uVar13 >= (short)uVar61) * uVar13;
  uVar14 = ((short)uVar14 < (short)uVar63) * uVar63 | ((short)uVar14 >= (short)uVar63) * uVar14;
  uVar15 = ((short)uVar15 < (short)uVar65) * uVar65 | ((short)uVar15 >= (short)uVar65) * uVar15;
  uVar16 = ((short)uVar16 < (short)uVar67) * uVar67 | ((short)uVar16 >= (short)uVar67) * uVar16;
  uVar17 = ((short)uVar17 < (short)uVar69) * uVar69 | ((short)uVar17 >= (short)uVar69) * uVar17;
  local_118[0] = local_238[0];
  local_118[1] = local_238[1];
  auVar4 = psubusw((undefined1  [16])local_238,(undefined1  [16])local_228);
  auVar5 = psubusw((undefined1  [16])local_228,(undefined1  [16])local_238);
  auVar5 = auVar5 | auVar4;
  local_108[0] = d7[0];
  local_108[1] = d7[1];
  auVar4 = psubusw((undefined1  [16])local_238,(undefined1  [16])d7);
  auVar8 = psubusw((undefined1  [16])d7,(undefined1  [16])local_238);
  auVar8 = auVar8 | auVar4;
  sVar19 = auVar5._0_2_;
  sVar20 = auVar8._0_2_;
  uVar36 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._2_2_;
  sVar20 = auVar8._2_2_;
  uVar40 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._4_2_;
  sVar20 = auVar8._4_2_;
  uVar42 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._6_2_;
  sVar20 = auVar8._6_2_;
  uVar44 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._8_2_;
  sVar20 = auVar8._8_2_;
  uVar46 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._10_2_;
  sVar20 = auVar8._10_2_;
  uVar48 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._12_2_;
  sVar20 = auVar8._12_2_;
  sVar21 = auVar8._14_2_;
  uVar50 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar5._14_2_;
  uVar52 = (ushort)(sVar21 < sVar19) * sVar19 | (ushort)(sVar21 >= sVar19) * sVar21;
  uVar7 = ((short)uVar36 < (short)uVar7) * uVar7 | ((short)uVar36 >= (short)uVar7) * uVar36;
  uVar11 = ((short)uVar40 < (short)uVar11) * uVar11 | ((short)uVar40 >= (short)uVar11) * uVar40;
  uVar12 = ((short)uVar42 < (short)uVar12) * uVar12 | ((short)uVar42 >= (short)uVar12) * uVar42;
  uVar13 = ((short)uVar44 < (short)uVar13) * uVar13 | ((short)uVar44 >= (short)uVar13) * uVar44;
  uVar14 = ((short)uVar46 < (short)uVar14) * uVar14 | ((short)uVar46 >= (short)uVar14) * uVar46;
  uVar15 = ((short)uVar48 < (short)uVar15) * uVar15 | ((short)uVar48 >= (short)uVar15) * uVar48;
  uVar16 = ((short)uVar50 < (short)uVar16) * uVar16 | ((short)uVar50 >= (short)uVar16) * uVar50;
  uVar17 = ((short)uVar52 < (short)uVar17) * uVar17 | ((short)uVar52 >= (short)uVar17) * uVar52;
  sVar19 = auVar3._0_2_;
  auVar38._0_2_ = (ushort)((short)uVar7 < sVar19) * sVar19 | ((short)uVar7 >= sVar19) * uVar7;
  sVar19 = auVar3._2_2_;
  auVar38._2_2_ = (ushort)((short)uVar11 < sVar19) * sVar19 | ((short)uVar11 >= sVar19) * uVar11;
  sVar19 = auVar3._4_2_;
  auVar38._4_2_ = (ushort)((short)uVar12 < sVar19) * sVar19 | ((short)uVar12 >= sVar19) * uVar12;
  sVar19 = auVar3._6_2_;
  auVar38._6_2_ = (ushort)((short)uVar13 < sVar19) * sVar19 | ((short)uVar13 >= sVar19) * uVar13;
  sVar19 = auVar3._8_2_;
  auVar38._8_2_ = (ushort)((short)uVar14 < sVar19) * sVar19 | ((short)uVar14 >= sVar19) * uVar14;
  sVar19 = auVar3._10_2_;
  auVar38._10_2_ = (ushort)((short)uVar15 < sVar19) * sVar19 | ((short)uVar15 >= sVar19) * uVar15;
  sVar19 = auVar3._12_2_;
  auVar38._12_2_ = (ushort)((short)uVar16 < sVar19) * sVar19 | ((short)uVar16 >= sVar19) * uVar16;
  sVar19 = auVar3._14_2_;
  auVar38._14_2_ = (ushort)((short)uVar17 < sVar19) * sVar19 | ((short)uVar17 >= sVar19) * uVar17;
  auVar3 = psubusw(auVar38,(undefined1  [16])limit0_1);
  sVar37 = -(ushort)(auVar3._0_2_ == 0);
  sVar41 = -(ushort)(auVar3._2_2_ == 0);
  sVar43 = -(ushort)(auVar3._4_2_ == 0);
  sVar45 = -(ushort)(auVar3._6_2_ == 0);
  sVar47 = -(ushort)(auVar3._8_2_ == 0);
  sVar49 = -(ushort)(auVar3._10_2_ == 0);
  sVar51 = -(ushort)(auVar3._12_2_ == 0);
  sVar53 = -(ushort)(auVar3._14_2_ == 0);
  p_1[0][0] = local_e8[0];
  p_1[0][1] = local_e8[1];
  _local_158 = local_d8[0];
  _sStack_150 = local_d8[1];
  p_1[1][0] = local_d8[0];
  p_1[1][1] = local_d8[1];
  local_78[0] = d4[0];
  local_78[1] = d4[1];
  _local_148 = local_228[0];
  _sStack_140 = local_228[1];
  local_68[0] = local_228[0];
  local_68[1] = local_228[1];
  local_a8 = sVar37;
  sStack_a6 = sVar41;
  sStack_a4 = sVar43;
  sStack_a2 = sVar45;
  sStack_a0 = sVar47;
  sStack_9e = sVar49;
  sStack_9c = sVar51;
  sStack_9a = sVar53;
  highbd_filter4_dual_sse2
            (p_1,&local_78,&local_178,(__m128i *)&local_198,(__m128i *)&local_a8,&thresh0_1,bd,&t80)
  ;
  auVar3 = psubusw((undefined1  [16])alVar2,(undefined1  [16])local_128);
  auVar4 = psubusw((undefined1  [16])local_128,(undefined1  [16])alVar2);
  auVar4 = auVar4 | auVar3;
  auVar3 = psubusw((undefined1  [16])local_118,(undefined1  [16])local_138);
  auVar5 = psubusw((undefined1  [16])local_138,(undefined1  [16])local_118);
  auVar5 = auVar5 | auVar3;
  sVar19 = auVar4._0_2_;
  sVar20 = auVar5._0_2_;
  uVar7 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._2_2_;
  sVar20 = auVar5._2_2_;
  uVar11 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._4_2_;
  sVar20 = auVar5._4_2_;
  uVar12 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._6_2_;
  sVar20 = auVar5._6_2_;
  uVar13 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._8_2_;
  sVar20 = auVar5._8_2_;
  uVar14 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._10_2_;
  sVar20 = auVar5._10_2_;
  uVar15 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._12_2_;
  sVar20 = auVar5._12_2_;
  sVar21 = auVar5._14_2_;
  uVar16 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._14_2_;
  uVar17 = (ushort)(sVar21 < sVar19) * sVar19 | (ushort)(sVar21 >= sVar19) * sVar21;
  uVar36 = ((short)uVar7 < (short)uVar54) * uVar54 | ((short)uVar7 >= (short)uVar54) * uVar7;
  uVar40 = ((short)uVar11 < (short)uVar57) * uVar57 | ((short)uVar11 >= (short)uVar57) * uVar11;
  uVar42 = ((short)uVar12 < (short)uVar59) * uVar59 | ((short)uVar12 >= (short)uVar59) * uVar12;
  uVar44 = ((short)uVar13 < (short)uVar61) * uVar61 | ((short)uVar13 >= (short)uVar61) * uVar13;
  uVar46 = ((short)uVar14 < (short)uVar63) * uVar63 | ((short)uVar14 >= (short)uVar63) * uVar14;
  uVar48 = ((short)uVar15 < (short)uVar65) * uVar65 | ((short)uVar15 >= (short)uVar65) * uVar15;
  uVar50 = ((short)uVar16 < (short)uVar67) * uVar67 | ((short)uVar16 >= (short)uVar67) * uVar16;
  uVar52 = ((short)uVar17 < (short)uVar69) * uVar69 | ((short)uVar17 >= (short)uVar69) * uVar17;
  auVar3 = psubusw((undefined1  [16])d0,(undefined1  [16])local_128);
  auVar4 = psubusw((undefined1  [16])local_128,(undefined1  [16])d0);
  auVar4 = auVar4 | auVar3;
  auVar5 = psubusw((undefined1  [16])local_108,(undefined1  [16])local_138);
  auVar3 = psubusw((undefined1  [16])local_138,(undefined1  [16])local_108);
  auVar3 = auVar3 | auVar5;
  sVar19 = auVar4._0_2_;
  sVar20 = auVar3._0_2_;
  uVar7 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._2_2_;
  sVar20 = auVar3._2_2_;
  uVar11 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._4_2_;
  sVar20 = auVar3._4_2_;
  uVar12 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._6_2_;
  sVar20 = auVar3._6_2_;
  uVar13 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._8_2_;
  sVar20 = auVar3._8_2_;
  uVar14 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._10_2_;
  sVar20 = auVar3._10_2_;
  uVar15 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._12_2_;
  sVar20 = auVar3._12_2_;
  sVar21 = auVar3._14_2_;
  uVar16 = (ushort)(sVar20 < sVar19) * sVar19 | (ushort)(sVar20 >= sVar19) * sVar20;
  sVar19 = auVar4._14_2_;
  uVar17 = (ushort)(sVar21 < sVar19) * sVar19 | (ushort)(sVar21 >= sVar19) * sVar21;
  auVar4._0_2_ = ((short)uVar7 < (short)uVar36) * uVar36 | ((short)uVar7 >= (short)uVar36) * uVar7;
  auVar4._2_2_ = ((short)uVar11 < (short)uVar40) * uVar40 |
                 ((short)uVar11 >= (short)uVar40) * uVar11;
  auVar4._4_2_ = ((short)uVar12 < (short)uVar42) * uVar42 |
                 ((short)uVar12 >= (short)uVar42) * uVar12;
  auVar4._6_2_ = ((short)uVar13 < (short)uVar44) * uVar44 |
                 ((short)uVar13 >= (short)uVar44) * uVar13;
  auVar4._8_2_ = ((short)uVar14 < (short)uVar46) * uVar46 |
                 ((short)uVar14 >= (short)uVar46) * uVar14;
  auVar4._10_2_ =
       ((short)uVar15 < (short)uVar48) * uVar48 | ((short)uVar15 >= (short)uVar48) * uVar15;
  auVar4._12_2_ =
       ((short)uVar16 < (short)uVar50) * uVar50 | ((short)uVar16 >= (short)uVar50) * uVar16;
  auVar4._14_2_ =
       ((short)uVar17 < (short)uVar52) * uVar52 | ((short)uVar17 >= (short)uVar52) * uVar17;
  auVar3 = psllw(_DAT_0046d7b0,ZEXT416(bd - 8));
  auVar3 = psubusw(auVar4,auVar3);
  auVar5._0_2_ = -(ushort)(auVar3._0_2_ == 0);
  auVar5._2_2_ = -(ushort)(auVar3._2_2_ == 0);
  auVar5._4_2_ = -(ushort)(auVar3._4_2_ == 0);
  auVar5._6_2_ = -(ushort)(auVar3._6_2_ == 0);
  auVar5._8_2_ = -(ushort)(auVar3._8_2_ == 0);
  auVar5._10_2_ = -(ushort)(auVar3._10_2_ == 0);
  auVar5._12_2_ = -(ushort)(auVar3._12_2_ == 0);
  auVar5._14_2_ = -(ushort)(auVar3._14_2_ == 0);
  auVar3._2_2_ = sVar41;
  auVar3._0_2_ = sVar37;
  auVar3._4_2_ = sVar43;
  auVar3._6_2_ = sVar45;
  auVar3._8_2_ = sVar47;
  auVar3._10_2_ = sVar49;
  auVar3._12_2_ = sVar51;
  auVar3._14_2_ = sVar53;
  auVar5 = auVar5 & auVar3;
  if ((((((((((((((((auVar5 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar5 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar5 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar5 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar5 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar5 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar5 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar5 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar5 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar5 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar5 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar5 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf]) {
    d4[1] = lStack_190;
    d4[0] = local_198;
  }
  else {
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    auVar6 = auVar6 ^ auVar5;
    sVar19 = (short)d0[0];
    sVar20 = d0[0]._2_2_;
    sVar21 = d0[0]._4_2_;
    sVar37 = d0[0]._6_2_;
    sVar41 = (short)d0[1];
    sVar43 = d0[1]._2_2_;
    sVar45 = d0[1]._4_2_;
    sVar47 = d0[1]._6_2_;
    sVar71 = (short)alVar2[0];
    sVar72 = alVar2[0]._2_2_;
    sVar73 = alVar2[0]._4_2_;
    sVar74 = alVar2[0]._6_2_;
    sVar75 = (short)alVar2[1];
    sVar76 = alVar2[1]._2_2_;
    sVar77 = alVar2[1]._4_2_;
    sVar78 = alVar2[1]._6_2_;
    sVar49 = (short)local_128[0] + local_158._0_2_ + sVar19 * 2 + sVar71 + 4;
    sVar51 = local_128[0]._2_2_ + local_158._2_2_ + sVar20 * 2 + sVar72 + 4;
    sVar53 = local_128[0]._4_2_ + sStack_154 + sVar21 * 2 + sVar73 + 4;
    sVar22 = local_128[0]._6_2_ + sStack_152 + sVar37 * 2 + sVar74 + 4;
    sVar23 = (short)local_128[1] + sStack_150 + sVar41 * 2 + sVar75 + 4;
    sVar24 = local_128[1]._2_2_ + sStack_14e + sVar43 * 2 + sVar76 + 4;
    sVar25 = local_128[1]._4_2_ + sStack_14c + sVar45 * 2 + sVar77 + 4;
    sVar26 = local_128[1]._6_2_ + sStack_14a + sVar47 * 2 + sVar78 + 4;
    sVar55 = (short)local_138[0];
    sVar58 = local_138[0]._2_2_;
    sVar60 = local_138[0]._4_2_;
    sVar62 = local_138[0]._6_2_;
    sVar64 = (short)local_138[1];
    sVar66 = local_138[1]._2_2_;
    sVar68 = local_138[1]._4_2_;
    sVar70 = local_138[1]._6_2_;
    auVar18._0_2_ = (ushort)(sVar19 + sVar55 + sVar71 + sVar49) >> 3;
    auVar18._2_2_ = (ushort)(sVar20 + sVar58 + sVar72 + sVar51) >> 3;
    auVar18._4_2_ = (ushort)(sVar21 + sVar60 + sVar73 + sVar53) >> 3;
    auVar18._6_2_ = (ushort)(sVar37 + sVar62 + sVar74 + sVar22) >> 3;
    auVar18._8_2_ = (ushort)(sVar41 + sVar64 + sVar75 + sVar23) >> 3;
    auVar18._10_2_ = (ushort)(sVar43 + sVar66 + sVar76 + sVar24) >> 3;
    auVar18._12_2_ = (ushort)(sVar45 + sVar68 + sVar77 + sVar25) >> 3;
    auVar18._14_2_ = (ushort)(sVar47 + sVar70 + sVar78 + sVar26) >> 3;
    sVar27 = local_148._0_2_ + sVar55;
    sVar28 = local_148._2_2_ + sVar58;
    sVar29 = sStack_144 + sVar60;
    sVar30 = sStack_142 + sVar62;
    sVar31 = sStack_140 + sVar64;
    sVar32 = sStack_13e + sVar66;
    sVar33 = sStack_13c + sVar68;
    sVar34 = sStack_13a + sVar70;
    auVar10._0_2_ = (ushort)(sVar27 + local_158._0_2_ + sVar49) >> 3;
    auVar10._2_2_ = (ushort)(sVar28 + local_158._2_2_ + sVar51) >> 3;
    auVar10._4_2_ = (ushort)(sVar29 + sStack_154 + sVar53) >> 3;
    auVar10._6_2_ = (ushort)(sVar30 + sStack_152 + sVar22) >> 3;
    auVar10._8_2_ = (ushort)(sVar31 + sStack_150 + sVar23) >> 3;
    auVar10._10_2_ = (ushort)(sVar32 + sStack_14e + sVar24) >> 3;
    auVar10._12_2_ = (ushort)(sVar33 + sStack_14c + sVar25) >> 3;
    auVar10._14_2_ = (ushort)(sVar34 + sStack_14a + sVar26) >> 3;
    sVar49 = (sVar49 - sVar19) + (short)local_118[0];
    sVar51 = (sVar51 - sVar20) + local_118[0]._2_2_;
    sVar53 = (sVar53 - sVar21) + local_118[0]._4_2_;
    sVar22 = (sVar22 - sVar37) + local_118[0]._6_2_;
    sVar23 = (sVar23 - sVar41) + (short)local_118[1];
    sVar24 = (sVar24 - sVar43) + local_118[1]._2_2_;
    sVar25 = (sVar25 - sVar45) + local_118[1]._4_2_;
    sVar26 = (sVar26 - sVar47) + local_118[1]._6_2_;
    auVar35._0_2_ = (ushort)((short)local_128[0] + sVar27 + sVar49) >> 3;
    auVar35._2_2_ = (ushort)(local_128[0]._2_2_ + sVar28 + sVar51) >> 3;
    auVar35._4_2_ = (ushort)(local_128[0]._4_2_ + sVar29 + sVar53) >> 3;
    auVar35._6_2_ = (ushort)(local_128[0]._6_2_ + sVar30 + sVar22) >> 3;
    auVar35._8_2_ = (ushort)((short)local_128[1] + sVar31 + sVar23) >> 3;
    auVar35._10_2_ = (ushort)(local_128[1]._2_2_ + sVar32 + sVar24) >> 3;
    auVar35._12_2_ = (ushort)(local_128[1]._4_2_ + sVar33 + sVar25) >> 3;
    auVar35._14_2_ = (ushort)(local_128[1]._6_2_ + sVar34 + sVar26) >> 3;
    sVar79 = (short)local_108[0];
    sVar19 = (sVar49 - sVar19) + sVar79;
    sVar49 = local_108[0]._2_2_;
    sVar20 = (sVar51 - sVar20) + sVar49;
    sVar51 = local_108[0]._4_2_;
    sVar21 = (sVar53 - sVar21) + sVar51;
    sVar53 = local_108[0]._6_2_;
    sVar37 = (sVar22 - sVar37) + sVar53;
    sVar22 = (short)local_108[1];
    sVar41 = (sVar23 - sVar41) + sVar22;
    sVar23 = local_108[1]._2_2_;
    sVar43 = (sVar24 - sVar43) + sVar23;
    sVar24 = local_108[1]._4_2_;
    sVar45 = (sVar25 - sVar45) + sVar24;
    sVar25 = local_108[1]._6_2_;
    sVar47 = (sVar26 - sVar47) + sVar25;
    auVar56._0_2_ = (ushort)(sVar55 + sVar27 + sVar19) >> 3;
    auVar56._2_2_ = (ushort)(sVar58 + sVar28 + sVar20) >> 3;
    auVar56._4_2_ = (ushort)(sVar60 + sVar29 + sVar21) >> 3;
    auVar56._6_2_ = (ushort)(sVar62 + sVar30 + sVar37) >> 3;
    auVar56._8_2_ = (ushort)(sVar64 + sVar31 + sVar41) >> 3;
    auVar56._10_2_ = (ushort)(sVar66 + sVar32 + sVar43) >> 3;
    auVar56._12_2_ = (ushort)(sVar68 + sVar33 + sVar45) >> 3;
    auVar56._14_2_ = (ushort)(sVar70 + sVar34 + sVar47) >> 3;
    sVar19 = (sVar19 - sVar71) + sVar79;
    sVar20 = (sVar20 - sVar72) + sVar49;
    sVar21 = (sVar21 - sVar73) + sVar51;
    sVar37 = (sVar37 - sVar74) + sVar53;
    sVar41 = (sVar41 - sVar75) + sVar22;
    sVar43 = (sVar43 - sVar76) + sVar23;
    sVar45 = (sVar45 - sVar77) + sVar24;
    sVar47 = (sVar47 - sVar78) + sVar25;
    auVar39._0_2_ = (ushort)(local_148._0_2_ + sVar27 + sVar19) >> 3;
    auVar39._2_2_ = (ushort)(local_148._2_2_ + sVar28 + sVar20) >> 3;
    auVar39._4_2_ = (ushort)(sStack_144 + sVar29 + sVar21) >> 3;
    auVar39._6_2_ = (ushort)(sStack_142 + sVar30 + sVar37) >> 3;
    auVar39._8_2_ = (ushort)(sStack_140 + sVar31 + sVar41) >> 3;
    auVar39._10_2_ = (ushort)(sStack_13e + sVar32 + sVar43) >> 3;
    auVar39._12_2_ = (ushort)(sStack_13c + sVar33 + sVar45) >> 3;
    auVar39._14_2_ = (ushort)(sStack_13a + sVar34 + sVar47) >> 3;
    auVar80._0_2_ =
         (ushort)(sVar79 + (short)local_118[0] + (sVar27 - local_158._0_2_) + sVar19) >> 3;
    auVar80._2_2_ = (ushort)(sVar49 + local_118[0]._2_2_ + (sVar28 - local_158._2_2_) + sVar20) >> 3
    ;
    auVar80._4_2_ = (ushort)(sVar51 + local_118[0]._4_2_ + (sVar29 - sStack_154) + sVar21) >> 3;
    auVar80._6_2_ = (ushort)(sVar53 + local_118[0]._6_2_ + (sVar30 - sStack_152) + sVar37) >> 3;
    auVar80._8_2_ = (ushort)(sVar22 + (short)local_118[1] + (sVar31 - sStack_150) + sVar41) >> 3;
    auVar80._10_2_ = (ushort)(sVar23 + local_118[1]._2_2_ + (sVar32 - sStack_14e) + sVar43) >> 3;
    auVar80._12_2_ = (ushort)(sVar24 + local_118[1]._4_2_ + (sVar33 - sStack_14c) + sVar45) >> 3;
    auVar80._14_2_ = (ushort)(sVar25 + local_118[1]._6_2_ + (sVar34 - sStack_14a) + sVar47) >> 3;
    auVar1._8_8_ = lStack_190;
    auVar1._0_8_ = local_198;
    d4 = (__m128i)(auVar56 & auVar5 | auVar1 & auVar6);
    local_188 = (__m128i)(auVar39 & auVar5 | (undefined1  [16])local_188 & auVar6);
    local_178 = (__m128i)(auVar35 & auVar5 | (undefined1  [16])local_178 & auVar6);
    local_168 = (__m128i)(auVar10 & auVar5 | (undefined1  [16])local_168 & auVar6);
    local_238 = (__m128i)(auVar80 & auVar5 | (undefined1  [16])local_118 & auVar6);
    local_298 = (__m128i)(auVar18 & auVar5 | auVar6 & (undefined1  [16])alVar2);
  }
  local_228 = local_188;
  local_e8 = local_178;
  local_d8 = local_168;
  highbd_transpose8x8_sse2
            (&d0,&local_298,&local_d8,&local_e8,&d4,&local_228,&local_238,&d7,&x0,&x1,&x2,&x3,&x4,
             &x5,&x6,&x7);
  *(longlong *)(s + -4) = x0[0];
  *(longlong *)s = x0[1];
  *(longlong *)(s + (long)p + -4) = x1[0];
  *(longlong *)(s + (long)p + -4 + 4) = x1[1];
  *(longlong *)(s + (long)(p * 2) + -4) = x2[0];
  *(longlong *)(s + (long)(p * 2) + -4 + 4) = x2[1];
  *(longlong *)(s + (long)(p * 3) + -4) = x3[0];
  *(longlong *)(s + (long)(p * 3) + -4 + 4) = x3[1];
  *(longlong *)(s + (long)(p * 4) + -4) = x4[0];
  *(longlong *)(s + (long)(p * 4) + -4 + 4) = x4[1];
  *(longlong *)(s + (long)(p * 5) + -4) = x5[0];
  *(longlong *)(s + (long)(p * 5) + -4 + 4) = x5[1];
  *(longlong *)(s + (long)(p * 6) + -4) = x6[0];
  *(longlong *)(s + (long)(p * 6) + -4 + 4) = x6[1];
  *(longlong *)(s + (long)(p * 7) + -4) = x7[0];
  *(longlong *)(s + (long)(p * 7) + -4 + 4) = x7[1];
  return;
}

Assistant:

void aom_highbd_lpf_vertical_8_dual_sse2(
    uint16_t *s, int p, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;

  x0 = _mm_loadu_si128((__m128i *)(s - 4 + 0 * p));
  x1 = _mm_loadu_si128((__m128i *)(s - 4 + 1 * p));
  x2 = _mm_loadu_si128((__m128i *)(s - 4 + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)(s - 4 + 3 * p));
  x4 = _mm_loadu_si128((__m128i *)(s - 4 + 4 * p));
  x5 = _mm_loadu_si128((__m128i *)(s - 4 + 5 * p));
  x6 = _mm_loadu_si128((__m128i *)(s - 4 + 6 * p));
  x7 = _mm_loadu_si128((__m128i *)(s - 4 + 7 * p));

  highbd_transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0, &d1,
                           &d2, &d3, &d4, &d5, &d6, &d7);

  highbd_lpf_internal_8_dual_sse2(&d0, &d7, &d1, &d6, &d2, &d5, &d3, &d4,
                                  blimit0, limit0, thresh0, blimit1, limit1,
                                  thresh1, bd);

  highbd_transpose8x8_sse2(&d0, &d1, &d2, &d3, &d4, &d5, &d6, &d7, &x0, &x1,
                           &x2, &x3, &x4, &x5, &x6, &x7);

  _mm_storeu_si128((__m128i *)(s - 4 + 0 * p), x0);
  _mm_storeu_si128((__m128i *)(s - 4 + 1 * p), x1);
  _mm_storeu_si128((__m128i *)(s - 4 + 2 * p), x2);
  _mm_storeu_si128((__m128i *)(s - 4 + 3 * p), x3);
  _mm_storeu_si128((__m128i *)(s - 4 + 4 * p), x4);
  _mm_storeu_si128((__m128i *)(s - 4 + 5 * p), x5);
  _mm_storeu_si128((__m128i *)(s - 4 + 6 * p), x6);
  _mm_storeu_si128((__m128i *)(s - 4 + 7 * p), x7);
}